

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_acs.cpp
# Opt level: O3

int __thiscall
DLevelScript::DoSpawnSpot(DLevelScript *this,int type,int spot,int tid,int angle,bool force)

{
  int iVar1;
  AActor *pAVar2;
  int iVar3;
  DAngle local_60;
  DVector3 local_58;
  DAngle local_38;
  
  if (spot == 0) {
    pAVar2 = (this->activator).field_0.p;
    iVar3 = 0;
    if (pAVar2 != (AActor *)0x0) {
      if (((pAVar2->super_DThinker).super_DObject.ObjectFlags & 0x20) == 0) {
        local_58.X = (pAVar2->__Pos).X;
        local_58.Y = (pAVar2->__Pos).Y;
        local_58.Z = (pAVar2->__Pos).Z;
        local_38.Degrees = (double)angle * 1.40625;
        iVar3 = DoSpawn(type,&local_58,tid,&local_38,force);
      }
      else {
        (this->activator).field_0.p = (AActor *)0x0;
      }
    }
  }
  else {
    pAVar2 = AActor::TIDHash[spot & 0x7f];
    if (pAVar2 == (AActor *)0x0) {
      iVar3 = 0;
    }
    else {
      iVar3 = 0;
      do {
        if (pAVar2->tid == spot) {
          local_58.X = (pAVar2->__Pos).X;
          local_58.Y = (pAVar2->__Pos).Y;
          local_58.Z = (pAVar2->__Pos).Z;
          local_60.Degrees = (double)angle * 1.40625;
          iVar1 = DoSpawn(type,&local_58,tid,&local_60,force);
          iVar3 = iVar3 + iVar1;
        }
        pAVar2 = pAVar2->inext;
      } while (pAVar2 != (AActor *)0x0);
    }
  }
  return iVar3;
}

Assistant:

int DLevelScript::DoSpawnSpot (int type, int spot, int tid, int angle, bool force)
{
	int spawned = 0;

	if (spot != 0)
	{
		FActorIterator iterator (spot);
		AActor *aspot;

		while ( (aspot = iterator.Next ()) )
		{
			spawned += DoSpawn (type, aspot->Pos(), tid, angle * (360. / 256), force);
		}
	}
	else if (activator != NULL)
	{
		spawned += DoSpawn (type, activator->Pos(), tid, angle * (360. / 256), force);
	}
	return spawned;
}